

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InprocComms.cpp
# Opt level: O1

void __thiscall helics::inproc::InprocComms::queue_tx_function(InprocComms *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *this_00;
  _Rb_tree_header *p_Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  undefined4 uVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  __native_type *p_Var6;
  bool bVar7;
  char cVar8;
  int iVar9;
  undefined1 this_02 [8];
  int *piVar10;
  _Base_ptr p_Var11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  socklen_t sVar13;
  pointer pcVar14;
  pointer pcVar15;
  _Base_ptr p_Var16;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  ActionMessage *command;
  ActionMessage *command_00;
  undefined8 uVar19;
  BrokerBase *this_03;
  _Alloc_hider _Var21;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  long lVar22;
  uint uVar23;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_04;
  string_view message;
  string_view brokerName;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  string_view message_04;
  string_view copyToName;
  string_view copyToName_00;
  string_view fmt;
  string_view configureString;
  string_view configureString_00;
  shared_ptr<helics::Broker> sVar24;
  pair<std::_Rb_tree_iterator<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>,_std::_Rb_tree_iterator<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>_>
  pVar25;
  pair<std::_Rb_tree_iterator<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>,_bool>
  pVar26;
  string_view copyFromName;
  string_view copyFromName_00;
  string_view brokerName_00;
  string_view name;
  string_view brokerName_01;
  format_args args;
  shared_ptr<helics::CommonCore> tcore;
  shared_ptr<helics::Broker> brk;
  shared_ptr<helics::Core> core;
  shared_ptr<helics::Broker> broker;
  map<helics::route_id,_std::shared_ptr<helics::BrokerBase>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>_>
  routes;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_270;
  string local_268;
  undefined4 local_244;
  ulong local_240;
  string local_238;
  BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
  *local_218;
  CommsInterface *local_210;
  undefined1 local_208 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8 [11];
  BrokerBase *local_140;
  long local_138;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_130;
  long local_128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_120;
  undefined1 local_118 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_110;
  undefined8 local_108;
  undefined8 local_100;
  Time TStack_f8;
  Time local_f0;
  Time TStack_e8;
  Time local_e0;
  __native_type _Stack_d8;
  byte local_b0 [24];
  size_t sStack_98;
  size_t local_90;
  __native_type *local_88;
  undefined8 local_80;
  pointer pbStack_78;
  pointer local_70;
  pointer pbStack_68;
  _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>_>
  local_60;
  size_t sVar17;
  size_t sVar20;
  
  sVar20 = (this->super_CommsInterface).name._M_string_length;
  sVar17 = (this->super_CommsInterface).localTargetAddress._M_string_length;
  if ((sVar20 != sVar17) ||
     ((sVar20 != 0 &&
      (iVar9 = bcmp((this->super_CommsInterface).name._M_dataplus._M_p,
                    (this->super_CommsInterface).localTargetAddress._M_dataplus._M_p,sVar20),
      iVar9 != 0)))) {
    pcVar15 = (this->super_CommsInterface).name._M_dataplus._M_p;
    pcVar14 = (this->super_CommsInterface).localTargetAddress._M_dataplus._M_p;
    if ((this->super_CommsInterface).brokerName._M_string_length != 0) {
      copyToName._M_str = pcVar14;
      copyToName._M_len = sVar17;
      copyFromName._M_str = pcVar15;
      copyFromName._M_len = sVar20;
      bVar7 = CoreFactory::copyCoreIdentifier(copyFromName,copyToName);
      if (bVar7) goto LAB_002a57b8;
      pcVar15 = (this->super_CommsInterface).name._M_dataplus._M_p;
      sVar20 = (this->super_CommsInterface).name._M_string_length;
      pcVar14 = (this->super_CommsInterface).localTargetAddress._M_dataplus._M_p;
      sVar17 = (this->super_CommsInterface).localTargetAddress._M_string_length;
    }
    copyToName_00._M_str = pcVar14;
    copyToName_00._M_len = sVar17;
    copyFromName_00._M_str = pcVar15;
    copyFromName_00._M_len = sVar20;
    bVar7 = BrokerFactory::copyBrokerIdentifier(copyFromName_00,copyToName_00);
    if (!bVar7) {
      CommsInterface::setRxStatus(&this->super_CommsInterface,ERRORED);
      CommsInterface::setTxStatus(&this->super_CommsInterface,ERRORED);
      return;
    }
  }
LAB_002a57b8:
  CommsInterface::setRxStatus(&this->super_CommsInterface,CONNECTED);
  this_00 = &(this->super_CommsInterface).brokerName;
  if (((this->super_CommsInterface).brokerName._M_string_length == 0) &&
     ((this->super_CommsInterface).brokerTargetAddress._M_string_length != 0)) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &(this->super_CommsInterface).brokerTargetAddress);
  }
  if ((this->super_CommsInterface).brokerName._M_string_length == 0) {
    if ((this->super_CommsInterface).serverMode == false) {
      local_270 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      lVar22 = 0;
      do {
        BrokerFactory::findJoinableBrokerOfType((CoreType)local_118);
        if (local_118 == (undefined1  [8])0x0) {
          this_02 = (undefined1  [8])0x0;
        }
        else {
          this_02 = (undefined1  [8])
                    __dynamic_cast(local_118,&Broker::typeinfo,&CoreBroker::typeinfo,0);
        }
        if (this_02 == (undefined1  [8])0x0) {
          this_04._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this_02 = (undefined1  [8])0x0;
        }
        else {
          this_04._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Stack_110;
          if (p_Stack_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Stack_110->_M_use_count = p_Stack_110->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Stack_110->_M_use_count = p_Stack_110->_M_use_count + 1;
            }
          }
        }
        if (local_270 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_270);
        }
        local_270 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_04._M_pi;
        if (this_02 == (undefined1  [8])0x0) {
          if ((this->super_CommsInterface).autoBroker == true) {
            in_R9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
                    (this->super_CommsInterface).brokerInitString._M_dataplus._M_p;
            iVar9 = 0x12;
            configureString_00._M_str =
                 (char *)(this->super_CommsInterface).brokerInitString._M_string_length;
            configureString_00._M_len = (size_t)"";
            sVar13 = 0x460ecc;
            sVar24 = BrokerFactory::create
                               ((CoreType)(timespec *)local_208,(string_view)ZEXT816(0x12),
                                configureString_00);
            this_02 = local_208;
            _Var18 = sVar24.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
            local_270 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_200._M_pi;
            local_208 = (undefined1  [8])0x0;
            _Stack_200._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if (this_04._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_04._M_pi);
              _Var18._M_pi = extraout_RDX_01;
            }
            if (_Stack_200._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_200._M_pi);
              _Var18._M_pi = extraout_RDX_02;
            }
            CoreBroker::connect((CoreBroker *)this_02,iVar9,(sockaddr *)_Var18._M_pi,sVar13);
          }
          else {
            if ((this->super_CommsInterface).connectionTimeout.__r < lVar22) {
              CommsInterface::setTxStatus(&this->super_CommsInterface,ERRORED);
              CommsInterface::setRxStatus(&this->super_CommsInterface,ERRORED);
              if (p_Stack_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_110);
              }
              goto LAB_002a6561;
            }
            local_208 = (undefined1  [8])0x0;
            _Stack_200._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xbebc200;
            do {
              iVar9 = nanosleep((timespec *)local_208,(timespec *)local_208);
              if (iVar9 != -1) break;
              piVar10 = __errno_location();
            } while (*piVar10 == 4);
            lVar22 = lVar22 + 200;
          }
        }
        if (p_Stack_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_110);
        }
      } while (this_02 == (undefined1  [8])0x0);
    }
    else {
      local_270 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_02 = (undefined1  [8])0x0;
    }
LAB_002a5cda:
    if (this_02 != (undefined1  [8])0x0) {
      sVar20 = *(long *)((long)this_02 + 0x78);
      if ((sVar20 == (this->super_CommsInterface).localTargetAddress._M_string_length) &&
         ((sVar20 == 0 ||
          (iVar9 = bcmp(*(void **)((long)this_02 + 0x70),
                        (this->super_CommsInterface).localTargetAddress._M_dataplus._M_p,sVar20),
          iVar9 == 0)))) {
        message_00._M_str = "broker == target";
        message_00._M_len = 0x10;
        CommsInterface::logError(&this->super_CommsInterface,message_00);
      }
      cVar8 = (**(code **)(*(size_type *)this_02 + 0x38))(this_02);
      if ((cVar8 == '\0') && ((this->super_CommsInterface).observer == false)) {
        message_01._M_str = "broker is not open to new federates";
        message_01._M_len = 0x23;
        CommsInterface::logError(&this->super_CommsInterface,message_01);
      }
    }
    CommsInterface::setTxStatus(&this->super_CommsInterface,CONNECTED);
    p_Var2 = &local_60._M_impl.super__Rb_tree_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_240 = 0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_218 = &(this->super_CommsInterface).txQueue;
    local_140 = (BrokerBase *)((long)this_02 + 8);
    local_210 = &this->super_CommsInterface;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
    do {
      local_118 = (undefined1  [8])0x0;
      p_Stack_110 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x9aac0f0000000000;
      local_108._0_4_ = 0;
      local_108._4_4_ = -1700000000;
      local_b0[0x10] = 0;
      local_b0[0x11] = 0;
      local_b0[0x12] = 0;
      local_b0[0x13] = 0;
      local_b0[0x14] = 0;
      local_b0[0x15] = 0;
      local_b0[0x16] = 0;
      local_b0[0x17] = 0;
      sStack_98 = 0;
      local_b0[0] = 0;
      local_b0[1] = 0;
      local_b0[2] = 0;
      local_b0[3] = 0;
      local_b0[4] = 0;
      local_b0[5] = 0;
      local_b0[6] = 0;
      local_b0[7] = 0;
      local_b0[8] = 0;
      local_b0[9] = 0;
      local_b0[10] = 0;
      local_b0[0xb] = 0;
      local_b0[0xc] = 0;
      local_b0[0xd] = 0;
      local_b0[0xe] = 0;
      local_b0[0xf] = 0;
      _Stack_d8.__data.__list.__prev = (__pthread_internal_list *)0x0;
      _Stack_d8.__data.__list.__next = (__pthread_internal_list *)0x0;
      _Stack_d8.__size[8] = 0;
      _Stack_d8.__size[9] = 0;
      _Stack_d8.__size[10] = 0;
      _Stack_d8.__size[0xb] = 0;
      _Stack_d8.__size[0xc] = 0;
      _Stack_d8.__size[0xd] = 0;
      _Stack_d8.__size[0xe] = 0;
      _Stack_d8.__size[0xf] = 0;
      _Stack_d8.__size[0x10] = 0;
      _Stack_d8.__size[0x11] = 0;
      _Stack_d8.__size[0x12] = 0;
      _Stack_d8.__size[0x13] = 0;
      _Stack_d8.__size[0x14] = 0;
      _Stack_d8.__size[0x15] = 0;
      _Stack_d8.__size[0x16] = 0;
      _Stack_d8.__size[0x17] = 0;
      local_e0.internalTimeCode = 0;
      _Stack_d8.__align = 0;
      local_f0.internalTimeCode = 0;
      TStack_e8.internalTimeCode = 0;
      local_100._0_2_ = 0;
      local_100._2_2_ = 0;
      local_100._4_4_ = 0;
      TStack_f8.internalTimeCode = 0;
      local_90 = 0x40;
      local_88 = &_Stack_d8;
      local_70 = (pointer)0x0;
      pbStack_68 = (pointer)0x0;
      local_80._0_1_ = false;
      local_80._1_1_ = false;
      local_80._2_1_ = false;
      local_80._3_1_ = '\0';
      local_80._4_4_ = 0;
      pbStack_78 = (pointer)0x0;
      gmlc::containers::
      BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
      ::pop((pair<helics::route_id,_helics::ActionMessage> *)local_208,local_218);
      uVar4 = local_208._0_4_;
      ActionMessage::operator=((ActionMessage *)local_118,(ActionMessage *)&_Stack_200);
      ActionMessage::~ActionMessage((ActionMessage *)&_Stack_200);
      p_Var6 = local_88;
      p_Var11 = &p_Var2->_M_header;
      p_Var16 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (((local_118._0_4_ != cmd_protocol_priority) && (local_118._0_4_ != cmd_protocol_big)) &&
         (local_118._0_4_ != cmd_protocol)) goto LAB_002a5ef1;
      if (uVar4 == 0) {
LAB_002a5f3e:
        if (this_02 != (undefined1  [8])0x0) {
          BrokerBase::addActionMessage(local_140,(ActionMessage *)local_118);
          goto LAB_002a6514;
        }
        prettyPrintString_abi_cxx11_(&local_268,(helics *)local_118,command);
        local_238._M_dataplus._M_p = local_268._M_dataplus._M_p;
        local_238._M_string_length = local_268._M_string_length;
        fmt.size_ = 0xd;
        fmt.data_ = (char *)0x4c;
        args.field_1.args_ = in_R9.args_;
        args.desc_ = (unsigned_long_long)&local_238;
        ::fmt::v11::vformat_abi_cxx11_
                  ((string *)local_208,
                   (v11 *)
                   "message directed to broker of comm system with no broker, message dropped {}",
                   fmt,args);
        message_02._M_str = (char *)local_208;
        message_02._M_len = (size_t)_Stack_200._M_pi;
        CommsInterface::logWarning(local_210,message_02);
        uVar19 = local_1f8[0]._M_allocated_capacity;
        _Var21._M_p = (pointer)local_208;
        if (local_208 != (undefined1  [8])local_1f8) {
LAB_002a5fdb:
          operator_delete(_Var21._M_p,uVar19 + 1);
        }
LAB_002a5fe3:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
        }
      }
      else if (uVar4 == -1) {
        if ((int)local_118._4_4_ < 0x9db) {
          if (local_118._4_4_ == 0xe9) {
            lVar22 = (long)local_88 + sStack_98;
            local_208 = (undefined1  [8])local_1f8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_208,local_88,lVar22);
            name._M_str = (char *)_Stack_200._M_pi;
            name._M_len = (size_t)&local_128;
            CoreFactory::findCore(name);
            if (local_208 != (undefined1  [8])local_1f8) {
              operator_delete((void *)local_208,local_1f8[0]._M_allocated_capacity + 1);
            }
            if (local_128 == 0) {
              local_244 = 0;
            }
            else {
              local_208 = (undefined1  [8])
                          __dynamic_cast(local_128,&Core::typeinfo,&CommonCore::typeinfo,0);
              if (local_208 == (undefined1  [8])0x0) {
                local_208 = (undefined1  [8])0x0;
                _Stack_200._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              }
              else {
                _Stack_200._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120;
                if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    local_120->_M_use_count = local_120->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    local_120->_M_use_count = local_120->_M_use_count + 1;
                  }
                }
              }
              if (local_208 == (undefined1  [8])0x0) {
                local_244 = 0;
              }
              else {
                local_268._M_dataplus._M_p._0_4_ = local_108._4_4_;
                pVar26 = std::
                         _Rb_tree<helics::route_id,std::pair<helics::route_id_const,std::shared_ptr<helics::BrokerBase>>,std::_Select1st<std::pair<helics::route_id_const,std::shared_ptr<helics::BrokerBase>>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::shared_ptr<helics::BrokerBase>>>>
                         ::_M_emplace_unique<helics::route_id,std::shared_ptr<helics::CommonCore>>
                                   ((_Rb_tree<helics::route_id,std::pair<helics::route_id_const,std::shared_ptr<helics::BrokerBase>>,std::_Select1st<std::pair<helics::route_id_const,std::shared_ptr<helics::BrokerBase>>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::shared_ptr<helics::BrokerBase>>>>
                                     *)&local_60,(route_id *)&local_268,
                                    (shared_ptr<helics::CommonCore> *)local_208);
                local_244 = (undefined4)CONCAT71(pVar26.first._M_node._1_7_,1);
              }
              if (_Stack_200._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_200._M_pi);
              }
            }
            local_208 = (undefined1  [8])local_1f8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_208,p_Var6,lVar22);
            brokerName_01._M_str = (char *)_Stack_200._M_pi;
            brokerName_01._M_len = (size_t)&local_138;
            BrokerFactory::findBroker(brokerName_01);
            if (local_208 != (undefined1  [8])local_1f8) {
              operator_delete((void *)local_208,local_1f8[0]._M_allocated_capacity + 1);
            }
            if (local_138 != 0) {
              local_208 = (undefined1  [8])
                          __dynamic_cast(local_138,&Broker::typeinfo,&CoreBroker::typeinfo,0);
              if (local_208 == (undefined1  [8])0x0) {
                local_208 = (undefined1  [8])0x0;
                _Stack_200._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              }
              else {
                _Stack_200._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130;
                if (local_130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    local_130->_M_use_count = local_130->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    local_130->_M_use_count = local_130->_M_use_count + 1;
                  }
                }
              }
              if (local_208 != (undefined1  [8])0x0) {
                local_268._M_dataplus._M_p._0_4_ = local_108._4_4_;
                pVar26 = std::
                         _Rb_tree<helics::route_id,std::pair<helics::route_id_const,std::shared_ptr<helics::BrokerBase>>,std::_Select1st<std::pair<helics::route_id_const,std::shared_ptr<helics::BrokerBase>>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::shared_ptr<helics::BrokerBase>>>>
                         ::_M_emplace_unique<helics::route_id,std::shared_ptr<helics::CoreBroker>>
                                   ((_Rb_tree<helics::route_id,std::pair<helics::route_id_const,std::shared_ptr<helics::BrokerBase>>,std::_Select1st<std::pair<helics::route_id_const,std::shared_ptr<helics::BrokerBase>>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::shared_ptr<helics::BrokerBase>>>>
                                     *)&local_60,(route_id *)&local_268,
                                    (shared_ptr<helics::CoreBroker> *)local_208);
                local_244 = (undefined4)CONCAT71(pVar26.first._M_node._1_7_,1);
              }
              if (_Stack_200._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_200._M_pi);
              }
            }
            if ((char)local_244 == '\0') {
              local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_268,"unable to establish Route to ","");
              local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,p_Var6,lVar22);
              uVar19 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_268._M_dataplus._M_p != &local_268.field_2) {
                uVar19 = local_268.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar19 < local_238._M_string_length + local_268._M_string_length) {
                uVar19 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_238._M_dataplus._M_p != &local_238.field_2) {
                  uVar19 = local_238.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar19 < local_238._M_string_length + local_268._M_string_length)
                goto LAB_002a6415;
                pbVar12 = CLI::std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&local_238,0,0,local_268._M_dataplus._M_p,
                                     local_268._M_string_length);
              }
              else {
LAB_002a6415:
                pbVar12 = CLI::std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                          _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&local_268,local_238._M_dataplus._M_p,
                                    local_238._M_string_length);
              }
              local_208 = (undefined1  [8])local_1f8;
              paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(pbVar12->_M_dataplus)._M_p;
              paVar1 = &pbVar12->field_2;
              if (paVar3 == paVar1) {
                local_1f8[0]._0_8_ = paVar1->_M_allocated_capacity;
                local_1f8[0]._8_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
              }
              else {
                local_1f8[0]._0_8_ = paVar1->_M_allocated_capacity;
                local_208 = (undefined1  [8])paVar3;
              }
              _Stack_200._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbVar12->_M_string_length;
              (pbVar12->_M_dataplus)._M_p = (pointer)paVar1;
              pbVar12->_M_string_length = 0;
              paVar1->_M_local_buf[0] = '\0';
              message_04._M_str = (char *)local_208;
              message_04._M_len = (size_t)_Stack_200._M_pi;
              CommsInterface::logError(local_210,message_04);
              if (local_208 != (undefined1  [8])local_1f8) {
                operator_delete((void *)local_208,local_1f8[0]._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_238._M_dataplus._M_p != &local_238.field_2) {
                operator_delete(local_238._M_dataplus._M_p,
                                local_238.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_268._M_dataplus._M_p != &local_268.field_2) {
                operator_delete(local_268._M_dataplus._M_p,
                                local_268.field_2._M_allocated_capacity + 1);
              }
            }
            if (local_130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130);
            }
            if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120);
            }
          }
          else {
            if (local_118._4_4_ != 0xf4) {
LAB_002a5ef1:
              if (uVar4 == 0) goto LAB_002a5f3e;
              goto joined_r0x002a5f04;
            }
            local_208._0_4_ = local_108._4_4_;
            pVar25 = std::
                     _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>_>
                     ::equal_range(&local_60,(key_type *)local_208);
            std::
            _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>_>
            ::_M_erase_aux(&local_60,(_Base_ptr)pVar25.first._M_node,
                           (_Base_ptr)pVar25.second._M_node);
          }
        }
        else if (local_118._4_4_ == 0x9db) {
          local_240 = 0x901;
        }
        else {
          if (local_118._4_4_ != 0x16570bf) goto LAB_002a5ef1;
          CommsInterface::setRxStatus(local_210,TERMINATED);
        }
      }
      else {
joined_r0x002a5f04:
        for (; p_Var16 != (_Base_ptr)0x0;
            p_Var16 = *(_Base_ptr *)
                       ((long)p_Var16 + 0x40 +
                       (ulong)((int)p_Var16[1]._M_color < (int)uVar4) * 8 + -0x30)) {
          if ((int)uVar4 <= (int)p_Var16[1]._M_color) {
            p_Var11 = p_Var16;
          }
        }
        p_Var16 = &p_Var2->_M_header;
        if (((_Rb_tree_header *)p_Var11 != p_Var2) &&
           (p_Var16 = p_Var11, (int)uVar4 < (int)p_Var11[1]._M_color)) {
          p_Var16 = &p_Var2->_M_header;
        }
        if ((_Rb_tree_header *)p_Var16 == p_Var2) {
          this_03 = local_140;
          if (this_02 == (undefined1  [8])0x0) {
            bVar7 = isIgnoreableCommand((ActionMessage *)local_118);
            if (bVar7) goto LAB_002a6514;
            local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_268,"unknown route, message dropped ","");
            prettyPrintString_abi_cxx11_(&local_238,(helics *)local_118,command_00);
            uVar19 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_268._M_dataplus._M_p != &local_268.field_2) {
              uVar19 = local_268.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar19 < local_238._M_string_length + local_268._M_string_length) {
              uVar19 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_238._M_dataplus._M_p != &local_238.field_2) {
                uVar19 = local_238.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar19 < local_238._M_string_length + local_268._M_string_length)
              goto LAB_002a6092;
              pbVar12 = CLI::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&local_238,0,0,local_268._M_dataplus._M_p,
                                   local_268._M_string_length);
            }
            else {
LAB_002a6092:
              pbVar12 = CLI::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&local_268,local_238._M_dataplus._M_p,
                                   local_238._M_string_length);
            }
            local_208 = (undefined1  [8])local_1f8;
            paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(pbVar12->_M_dataplus)._M_p;
            paVar1 = &pbVar12->field_2;
            if (paVar3 == paVar1) {
              local_1f8[0]._0_8_ = paVar1->_M_allocated_capacity;
              local_1f8[0]._8_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
            }
            else {
              local_1f8[0]._0_8_ = paVar1->_M_allocated_capacity;
              local_208 = (undefined1  [8])paVar3;
            }
            _Stack_200._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbVar12->_M_string_length;
            (pbVar12->_M_dataplus)._M_p = (pointer)paVar1;
            pbVar12->_M_string_length = 0;
            paVar1->_M_local_buf[0] = '\0';
            message_03._M_str = (char *)local_208;
            message_03._M_len = (size_t)_Stack_200._M_pi;
            CommsInterface::logWarning(local_210,message_03);
            if (local_208 != (undefined1  [8])local_1f8) {
              operator_delete((void *)local_208,local_1f8[0]._M_allocated_capacity + 1);
            }
            uVar19 = local_238.field_2._M_allocated_capacity;
            _Var21._M_p = local_238._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238._M_dataplus._M_p != &local_238.field_2) goto LAB_002a5fdb;
            goto LAB_002a5fe3;
          }
        }
        else {
          this_03 = (BrokerBase *)p_Var16[1]._M_parent;
        }
        BrokerBase::addActionMessage(this_03,(ActionMessage *)local_118);
      }
LAB_002a6514:
      ActionMessage::~ActionMessage((ActionMessage *)local_118);
    } while ((local_240 & 1) == 0);
    std::
    _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>_>
    ::clear(&local_60);
    if (local_270 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_270);
    }
    CommsInterface::setTxStatus(local_210,TERMINATED);
    std::
    _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>_>
    ::~_Rb_tree(&local_60);
    this_04._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    local_240 = 0;
    this_02 = (undefined1  [8])0x0;
    local_218 = (BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
                 *)0x0;
    local_270 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      if (this_02 != (undefined1  [8])0x0) goto LAB_002a5cda;
      brokerName_00._M_str = (char *)(this->super_CommsInterface).brokerName._M_string_length;
      brokerName_00._M_len = (size_t)local_118;
      BrokerFactory::findBroker(brokerName_00);
      if (local_118 == (undefined1  [8])0x0) {
        this_02 = (undefined1  [8])0x0;
      }
      else {
        this_02 = (undefined1  [8])
                  __dynamic_cast(local_118,&Broker::typeinfo,&CoreBroker::typeinfo,0);
      }
      if (this_02 == (undefined1  [8])0x0) {
        this_04._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        this_02 = (undefined1  [8])0x0;
      }
      else {
        this_04._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Stack_110;
        if (p_Stack_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Stack_110->_M_use_count = p_Stack_110->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Stack_110->_M_use_count = p_Stack_110->_M_use_count + 1;
          }
        }
      }
      if (local_270 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_270);
      }
      if (this_02 == (undefined1  [8])0x0) {
        if ((this->super_CommsInterface).autoBroker == true) {
          pcVar15 = (this->super_CommsInterface).brokerName._M_dataplus._M_p;
          in_R9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
                  (this->super_CommsInterface).brokerInitString._M_dataplus._M_p;
          brokerName._M_str = (char *)(this->super_CommsInterface).brokerName._M_string_length;
          brokerName._M_len = 0x12;
          iVar9 = 0x12;
          configureString._M_str =
               (char *)(this->super_CommsInterface).brokerInitString._M_string_length;
          configureString._M_len = (size_t)pcVar15;
          sVar24 = BrokerFactory::create
                             ((CoreType)
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_208,brokerName,configureString);
          _Var5._M_pi = _Stack_200._M_pi;
          this_02 = local_208;
          sVar13 = (socklen_t)pcVar15;
          _Var18 = sVar24.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
          local_208 = (undefined1  [8])0x0;
          _Stack_200._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (this_04._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_04._M_pi);
            _Var18._M_pi = extraout_RDX;
          }
          if (_Stack_200._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_200._M_pi);
            _Var18._M_pi = extraout_RDX_00;
          }
          bVar7 = true;
          CoreBroker::connect((CoreBroker *)this_02,iVar9,(sockaddr *)_Var18._M_pi,sVar13);
          this_04._M_pi = _Var5._M_pi;
        }
        else if ((this->super_CommsInterface).connectionTimeout.__r < (long)local_240) {
          CommsInterface::setTxStatus(&this->super_CommsInterface,ERRORED);
          CommsInterface::setRxStatus(&this->super_CommsInterface,ERRORED);
          bVar7 = false;
        }
        else {
          local_208 = (undefined1  [8])0x0;
          _Stack_200._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xbebc200;
          do {
            iVar9 = nanosleep((timespec *)local_208,(timespec *)local_208);
            if (iVar9 != -1) break;
            piVar10 = __errno_location();
          } while (*piVar10 == 4);
          local_240 = local_240 + 200;
          bVar7 = true;
        }
      }
      else {
        cVar8 = (**(code **)(*(size_type *)this_02 + 0x38))(this_02);
        bVar7 = true;
        if ((cVar8 == '\0') && ((this->super_CommsInterface).observer == false)) {
          iVar9 = (int)local_218;
          if (iVar9 == 0) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_208,"broker is not open to new federates ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           this_00);
            message._M_str = (char *)local_208;
            message._M_len = (size_t)_Stack_200._M_pi;
            CommsInterface::logError(&this->super_CommsInterface,message);
            if (local_208 != (undefined1  [8])local_1f8) {
              operator_delete((void *)local_208,local_1f8[0]._M_allocated_capacity + 1);
            }
          }
          if (this_04._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_04._M_pi);
          }
          this_01 = p_Stack_110;
          local_118 = (undefined1  [8])0x0;
          p_Stack_110 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
          }
          uVar23 = iVar9 + 1;
          if (iVar9 < 2) {
            if (iVar9 == 0) {
              local_208 = (undefined1  [8])0x0;
              _Stack_200._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xbebc200;
              do {
                iVar9 = nanosleep((timespec *)local_208,(timespec *)local_208);
                if (iVar9 != -1) break;
                piVar10 = __errno_location();
              } while (*piVar10 == 4);
            }
            BrokerFactory::cleanUpBrokers((milliseconds)0xc8);
            local_240 = local_240 + 200;
            if ((this->super_CommsInterface).connectionTimeout.__r < (long)local_240) {
              CommsInterface::setTxStatus(&this->super_CommsInterface,ERRORED);
              CommsInterface::setRxStatus(&this->super_CommsInterface,ERRORED);
              this_02 = (undefined1  [8])0x0;
              local_218 = (BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
                           *)(ulong)uVar23;
              this_04._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              bVar7 = false;
            }
            else {
              this_02 = (undefined1  [8])0x0;
              local_218 = (BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
                           *)(ulong)uVar23;
              this_04._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              bVar7 = true;
            }
          }
          else {
            CommsInterface::setTxStatus(&this->super_CommsInterface,ERRORED);
            CommsInterface::setRxStatus(&this->super_CommsInterface,ERRORED);
            this_02 = (undefined1  [8])0x0;
            this_04._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_218 = (BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
                         *)(ulong)uVar23;
            bVar7 = false;
          }
        }
      }
      if (p_Stack_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_110);
      }
      local_270 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_04._M_pi;
    } while (bVar7);
  }
LAB_002a6561:
  if (this_04._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_04._M_pi);
  }
  return;
}

Assistant:

void InprocComms::queue_tx_function()
    {
        using std::chrono::milliseconds;
        // make sure the link to the localTargetAddress is in place
        if (name != localTargetAddress) {
            if (!brokerName.empty()) {
                if (!CoreFactory::copyCoreIdentifier(name, localTargetAddress)) {
                    if (!BrokerFactory::copyBrokerIdentifier(name, localTargetAddress)) {
                        setRxStatus(ConnectionStatus::ERRORED);
                        setTxStatus(ConnectionStatus::ERRORED);
                        return;
                    }
                }
            } else {
                if (!BrokerFactory::copyBrokerIdentifier(name, localTargetAddress)) {
                    setRxStatus(ConnectionStatus::ERRORED);
                    setTxStatus(ConnectionStatus::ERRORED);
                    return;
                }
            }
        }
        setRxStatus(ConnectionStatus::CONNECTED);
        std::shared_ptr<CoreBroker> tbroker;

        if (brokerName.empty()) {
            if (!brokerTargetAddress.empty()) {
                brokerName = brokerTargetAddress;
            }
        }

        if (!brokerName.empty()) {
            milliseconds totalSleep(0);
            int ecount{0};
            while (!tbroker) {
                auto broker = BrokerFactory::findBroker(brokerName);
                tbroker = std::dynamic_pointer_cast<CoreBroker>(broker);
                if (!tbroker) {
                    if (autoBroker) {
                        tbroker = std::static_pointer_cast<CoreBroker>(
                            BrokerFactory::create(CoreType::INPROC, brokerName, brokerInitString));
                        tbroker->connect();
                    } else {
                        if (totalSleep > connectionTimeout) {
                            setTxStatus(ConnectionStatus::ERRORED);
                            setRxStatus(ConnectionStatus::ERRORED);
                            return;
                        }
                        std::this_thread::sleep_for(milliseconds(200));
                        totalSleep += milliseconds(200);
                    }
                } else {
                    if (!tbroker->isOpenToNewFederates() && !observer) {
                        ++ecount;
                        if (ecount == 1) {
                            logError("broker is not open to new federates " + brokerName);
                        }
                        tbroker = nullptr;
                        broker = nullptr;
                        if (ecount >= 3) {
                            setTxStatus(ConnectionStatus::ERRORED);
                            setRxStatus(ConnectionStatus::ERRORED);
                            return;
                        }
                        if (ecount == 1) {
                            std::this_thread::sleep_for(milliseconds(200));
                        }
                        BrokerFactory::cleanUpBrokers(milliseconds(200));
                        totalSleep += milliseconds(200);
                        if (totalSleep > milliseconds(connectionTimeout)) {
                            setTxStatus(ConnectionStatus::ERRORED);
                            setRxStatus(ConnectionStatus::ERRORED);
                            return;
                        }
                    }
                }
            }
        } else if (!serverMode) {
            milliseconds totalSleep(0);
            while (!tbroker) {
                auto broker = BrokerFactory::findJoinableBrokerOfType(CoreType::INPROC);
                tbroker = std::dynamic_pointer_cast<CoreBroker>(broker);
                if (!tbroker) {
                    if (autoBroker) {
                        tbroker = std::static_pointer_cast<CoreBroker>(
                            BrokerFactory::create(CoreType::INPROC, "", brokerInitString));
                        tbroker->connect();
                    } else {
                        if (totalSleep > connectionTimeout) {
                            setTxStatus(ConnectionStatus::ERRORED);
                            setRxStatus(ConnectionStatus::ERRORED);
                            return;
                        }
                        std::this_thread::sleep_for(milliseconds(200));
                        totalSleep += milliseconds(200);
                    }
                }
            }
        }
        if (tbroker) {
            if (tbroker->getIdentifier() == localTargetAddress) {
                logError("broker == target");
            }
            if (!tbroker->isOpenToNewFederates() && !observer) {
                logError("broker is not open to new federates");
            }
        }

        setTxStatus(ConnectionStatus::CONNECTED);
        std::map<route_id, std::shared_ptr<BrokerBase>> routes;
        bool haltLoop{false};
        while (!haltLoop) {
            route_id rid;
            ActionMessage cmd;

            std::tie(rid, cmd) = txQueue.pop();
            bool processed = false;
            if (isProtocolCommand(cmd)) {
                if (rid == control_route) {
                    switch (cmd.messageID) {
                        case NEW_ROUTE: {
                            auto newroute = cmd.payload.to_string();
                            bool foundRoute = false;
                            auto core = CoreFactory::findCore(std::string(newroute));
                            if (core) {
                                auto tcore = std::dynamic_pointer_cast<CommonCore>(core);
                                if (tcore) {
                                    routes.emplace(route_id{cmd.getExtraData()}, std::move(tcore));
                                    foundRoute = true;
                                }
                            }
                            auto brk = BrokerFactory::findBroker(std::string(newroute));

                            if (brk) {
                                auto cbrk = std::dynamic_pointer_cast<CoreBroker>(brk);
                                if (cbrk) {
                                    routes.emplace(route_id{cmd.getExtraData()}, std::move(cbrk));
                                    foundRoute = true;
                                }
                            }
                            if (!foundRoute) {
                                logError(std::string("unable to establish Route to ") +
                                         std::string(newroute));
                            }
                            processed = true;
                        } break;
                        case REMOVE_ROUTE:
                            routes.erase(route_id{cmd.getExtraData()});
                            processed = true;
                            break;
                        case CLOSE_RECEIVER:
                            setRxStatus(ConnectionStatus::TERMINATED);
                            processed = true;
                            break;
                        case DISCONNECT:
                            haltLoop = true;
                            continue;
                    }
                }
            }
            if (processed) {
                continue;
            }

            if (rid == parent_route_id) {
                if (tbroker) {
                    tbroker->addActionMessage(std::move(cmd));
                } else {
                    logWarning(fmt::format(
                        "message directed to broker of comm system with no broker, message dropped {}",
                        prettyPrintString(cmd)));
                }
            } else {
                auto rt_find = routes.find(rid);
                if (rt_find != routes.end()) {
                    rt_find->second->addActionMessage(std::move(cmd));
                } else {
                    if (tbroker) {
                        tbroker->addActionMessage(std::move(cmd));
                    } else {
                        if (!isIgnoreableCommand(cmd)) {
                            logWarning(std::string("unknown route, message dropped ") +
                                       prettyPrintString(cmd));
                        }
                    }
                }
            }
        }  // while (!haltLoop)

        routes.clear();
        tbroker = nullptr;

        setTxStatus(ConnectionStatus::TERMINATED);
    }